

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall
Database::update_iterator
          (Database *this,DatabaseName *name,uint64_t byte_offset,uint64_t file_offset)

{
  iterator iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *__k;
  string_view_t fmt;
  
  __k = &name->id;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file_offset;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          ::find(&(this->iterators)._M_t,__k);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->iterators)._M_t._M_impl.super__Rb_tree_header) {
    fmt.size_ = (size_t)__k;
    fmt.data_ = (char *)0x20;
    spdlog::warn<std::__cxx11::string>((spdlog *)"Can\'t update invalid iterator {}",fmt,args);
    return;
  }
  if (file_offset < *(ulong *)(iVar1._M_node + 0xc)) {
    iVar1._M_node[0xc]._M_parent = (_Base_ptr)byte_offset;
    iVar1._M_node[0xc]._M_left = (_Base_ptr)file_offset;
    OnDiskIterator::save((OnDiskIterator *)(iVar1._M_node + 2));
    return;
  }
  OnDiskIterator::drop((OnDiskIterator *)(iVar1._M_node + 2));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
  ::erase(&(this->iterators)._M_t,__k);
  return;
}

Assistant:

void Database::update_iterator(const DatabaseName &name, uint64_t byte_offset,
                               uint64_t file_offset) {
    auto it = iterators.find(name.get_id());
    if (it == iterators.end()) {
        spdlog::warn("Can't update invalid iterator {}", name.get_id());
        return;
    }
    OnDiskIterator &iter = it->second;
    if (file_offset >= iter.get_total_files()) {
        iter.drop();
        iterators.erase(name.get_id());
    } else {
        iter.update_offset(byte_offset, file_offset);
        iter.save();
    }
}